

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMemCheckHandler::PostProcessBoundsCheckerTest
          (cmCTestMemCheckHandler *this,cmCTestTestResult *res,int test)

{
  uint uVar1;
  cmCTest *pcVar2;
  bool bVar3;
  ostream *poVar4;
  string *psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string ofile;
  char *local_3f0 [4];
  string log;
  string line;
  ostringstream cmCTestLog_msg;
  uint auStack_218 [122];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"PostProcessBoundsCheckerTest for : ");
  poVar4 = std::operator<<(poVar4,(string *)res);
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x50d,line._M_dataplus._M_p,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TestOutputFileNames(this,test,&files);
  if (files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string
              ((string *)&ofile,
               (string *)
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if (ofile._M_string_length != 0) {
      std::ifstream::ifstream(&cmCTestLog_msg,ofile._M_dataplus._M_p,_S_in);
      uVar1 = *(uint *)((long)auStack_218 + *(long *)(_cmCTestLog_msg + -0x18));
      if ((uVar1 & 5) == 0) {
        psVar5 = &res->Output;
        std::__cxx11::string::append((char *)psVar5);
        std::__cxx11::string::append((char *)psVar5);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        while( true ) {
          bVar3 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&cmCTestLog_msg,&line,(bool *)0x0,0xffffffffffffffff);
          if (!bVar3) break;
          std::__cxx11::string::append((string *)psVar5);
          std::__cxx11::string::append((char *)psVar5);
        }
        psVar5 = &line;
      }
      else {
        std::operator+(&log,"Cannot read memory tester output file: ",&ofile);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&line);
        poVar4 = std::operator<<((ostream *)&line,(string *)&log);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x51c,local_3f0[0],false);
        std::__cxx11::string::~string((string *)local_3f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&line);
        psVar5 = &log;
      }
      std::__cxx11::string::~string((string *)psVar5);
      std::ifstream::~ifstream(&cmCTestLog_msg);
      if ((uVar1 & 5) == 0) {
        cmsys::SystemTools::Delay(1000);
        cmsys::SystemTools::RemoveFile(&this->BoundsCheckerDPBDFile);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Remove: ");
        poVar4 = std::operator<<(poVar4,(string *)&this->BoundsCheckerDPBDFile);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x52b,line._M_dataplus._M_p,
                     (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        cmsys::SystemTools::RemoveFile(&this->BoundsCheckerXMLFile);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Remove: ");
        poVar4 = std::operator<<(poVar4,(string *)&this->BoundsCheckerXMLFile);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x52f,line._M_dataplus._M_p,
                     (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
    }
    std::__cxx11::string::~string((string *)&ofile);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  return;
}

Assistant:

void cmCTestMemCheckHandler::PostProcessBoundsCheckerTest(
  cmCTestTestResult& res, int test)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "PostProcessBoundsCheckerTest for : " << res.Name
                                                           << std::endl,
                     this->Quiet);
  std::vector<std::string> files;
  this->TestOutputFileNames(test, files);
  if (files.empty()) {
    return;
  }
  std::string ofile = files[0];
  if (ofile.empty()) {
    return;
  }
  // put a scope around this to close ifs so the file can be removed
  {
    cmsys::ifstream ifs(ofile.c_str());
    if (!ifs) {
      std::string log = "Cannot read memory tester output file: " + ofile;
      cmCTestLog(this->CTest, ERROR_MESSAGE, log << std::endl);
      return;
    }
    res.Output += BOUNDS_CHECKER_MARKER;
    res.Output += "\n";
    std::string line;
    while (cmSystemTools::GetLineFromStream(ifs, line)) {
      res.Output += line;
      res.Output += "\n";
    }
  }
  cmSystemTools::Delay(1000);
  cmSystemTools::RemoveFile(this->BoundsCheckerDPBDFile);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Remove: " << this->BoundsCheckerDPBDFile << std::endl,
                     this->Quiet);
  cmSystemTools::RemoveFile(this->BoundsCheckerXMLFile);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Remove: " << this->BoundsCheckerXMLFile << std::endl,
                     this->Quiet);
}